

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_14174cb::SADx3Test_ShortSrc_Test::~SADx3Test_ShortSrc_Test
          (SADx3Test_ShortSrc_Test *this)

{
  void *in_RDI;
  
  ~SADx3Test_ShortSrc_Test((SADx3Test_ShortSrc_Test *)0xc39c18);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_P(SADx3Test, ShortSrc) {
  int tmp_stride = source_stride_;
  source_stride_ >>= 1;
  int test_count = 1000;
  while (test_count > 0) {
    FillRandom(source_data_, source_stride_);
    FillRandom(GetReference(0), reference_stride_);
    FillRandom(GetReference(1), reference_stride_);
    FillRandom(GetReference(2), reference_stride_);
    FillRandom(GetReference(3), reference_stride_);
    CheckSADs();
    test_count -= 1;
  }
  source_stride_ = tmp_stride;
}